

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmselect.c
# Opt level: O0

void setup_wake_mechanism(CMtrans_services svc,select_data_ptr *sdp)

{
  long lVar1;
  int iVar2;
  long *in_RSI;
  void *in_RDI;
  void *unaff_retaddr;
  select_data_ptr sd;
  int filedes [2];
  int local_18;
  undefined4 local_14;
  
  lVar1 = *in_RSI;
  if ((*(long *)(lVar1 + 0x40) != 0) &&
     (iVar2 = (**(code **)((long)in_RDI + 0xb8))
                        (*(undefined8 *)(lVar1 + 0x40),
                         "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmselect.c"
                         ,0x3d4), iVar2 == 0)) {
    printf("%s:%u: failed assertion `%s\'\n",
           "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmselect.c"
           ,0x3d4,"CM_LOCKED(svc, sd->cm)");
    abort();
  }
  if (*(int *)(lVar1 + 0x4c) == -1) {
    iVar2 = pipe(&local_18);
    if (iVar2 == 0) {
      *(int *)(lVar1 + 0x4c) = local_18;
      *(undefined4 *)(lVar1 + 0x50) = local_14;
      (**(code **)((long)in_RDI + 0x38))
                (*(undefined8 *)(lVar1 + 0x40),0xc,"CMSelect Adding read_wake_fd as action on fd %d"
                 ,*(undefined4 *)(lVar1 + 0x4c));
      libcmselect_LTX_add_select(svc,sdp,filedes[1],(select_list_func)sd,unaff_retaddr,in_RDI);
    }
    else {
      perror("Pipe for wake not created.  Wake mechanism inoperative.");
    }
  }
  return;
}

Assistant:

static void
setup_wake_mechanism(CMtrans_services svc, select_data_ptr *sdp)
{
    SOCKET filedes[2];

    select_data_ptr sd = *((select_data_ptr *)sdp);
    if (sd->cm) {
	/* assert CM is locked */
	assert(CM_LOCKED(svc, sd->cm));
    }
    if (sd->wake_read_fd != -1) return;
    if (pipe(&filedes[0]) != 0) {
	perror("Pipe for wake not created.  Wake mechanism inoperative.");
	return;
    }
    sd->wake_read_fd = filedes[0];
    sd->wake_write_fd = filedes[1];
    svc->verbose(sd->cm, CMSelectVerbose, "CMSelect Adding read_wake_fd as action on fd %d",
		   sd->wake_read_fd);
    libcmselect_LTX_add_select(svc, sdp, (int)sd->wake_read_fd, read_wake_fd, 
			       (void*)(intptr_t)sd->wake_read_fd, NULL);
}